

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O0

void __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVector>::ComputeValidJointActions
          (BGIP_SolverBranchAndBound<JointPolicyPureVector> *this,Index jt_bgI,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *valid_JAs,BGIP_BnB_NodePtr *node)

{
  Index IVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  const_reference pvVar2;
  type this_01;
  size_t sVar3;
  shared_ptr<BGIP_BnB_Node> *in_RCX;
  long in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> curr_JA;
  Index depth_node;
  Index depth_tI;
  Index tI;
  Index agI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> valid_action_set;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indTypes;
  undefined4 in_stack_000000d8;
  BGIP_BnB_Node *in_stack_000000e8;
  BGIP_SolverBranchAndBound<JointPolicyPureVector> *in_stack_000000f0;
  Index in_stack_ffffffffffffff18;
  Index in_stack_ffffffffffffff1c;
  BGIP_SolverBranchAndBound<JointPolicyPureVector> *in_stack_ffffffffffffff20;
  allocator_type *in_stack_ffffffffffffff28;
  allocator_type *in_stack_ffffffffffffff30;
  Index in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  value_type in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  Index in_stack_ffffffffffffff74;
  BayesianGameBase *in_stack_ffffffffffffff78;
  uint local_58;
  
  boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::operator->
            ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)(in_RDI + 0x128));
  this_00 = BayesianGameBase::JointToIndividualTypeIndices
                      (in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x132301);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             (value_type_conflict3 *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x13232e);
  local_58 = 0;
  while( true ) {
    if (*(ulong *)(in_RDI + 0x1d8) <= (ulong)local_58) break;
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (this_00,(ulong)local_58);
    in_stack_ffffffffffffff40 = *pvVar2;
    in_stack_ffffffffffffff3c = local_58;
    boost::shared_ptr<BGIP_BnB_Node>::shared_ptr
              ((shared_ptr<BGIP_BnB_Node> *)in_stack_ffffffffffffff20,
               (shared_ptr<BGIP_BnB_Node> *)
               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    IVar1 = GetDepthFirstSpecified
                      (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18
                       ,(BGIP_BnB_NodePtr *)0x1323ad);
    boost::shared_ptr<BGIP_BnB_Node>::~shared_ptr((shared_ptr<BGIP_BnB_Node> *)0x1323bb);
    in_stack_ffffffffffffff44 = IVar1;
    this_01 = boost::shared_ptr<BGIP_BnB_Node>::operator->(in_RCX);
    sVar3 = BGIP_BnB_Node::GetDepth(this_01);
    if (IVar1 <= (uint)sVar3) {
      boost::shared_ptr<BGIP_BnB_Node>::operator->(in_RCX);
      in_stack_ffffffffffffff38 =
           BGIP_BnB_Node::GetSpecifiedAction(in_stack_000000e8,this._4_4_,(Index)this);
      in_stack_ffffffffffffff30 =
           (allocator_type *)
           std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      in_stack_ffffffffffffff20,
                      CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      *(Index *)in_stack_ffffffffffffff30 = in_stack_ffffffffffffff38;
    }
    local_58 = local_58 + 1;
  }
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x1324b6);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),in_stack_ffffffffffffff30
            );
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x1324d6);
  GenerateJointActions
            (in_stack_000000f0,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_000000e8,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(jt_bgI,in_stack_000000d8),valid_JAs._4_4_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff30);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff30);
  return;
}

Assistant:

void 
    ComputeValidJointActions(
            Index jt_bgI, 
            std::vector<Index>& valid_JAs,
            BGIP_BnB_NodePtr node){
    const std::vector<Index> &indTypes=
        _m_bgip->JointToIndividualTypeIndices(jt_bgI);

#if DEBUG_VALID_ACTIONS            
    std::cout << "\tComputing valid JAs for indTypes=" <<
        SoftPrintVector(indTypes) << std::endl;
#endif

    //  valid_action_set[agI] stores the valid action for agent i
    std::vector< Index > valid_action_set(_m_nrAgents, UNSPECIFIED_ACTION);
    for(Index agI=0; agI < _m_nrAgents; agI++)
    {
        Index tI = indTypes[agI];
#if CACHE_IMPLIED_JPOL
        valid_action_set.at(agI) = _m_impliedJPol.at(agI).at(tI);
#else            
        //should be pre-computed with the ordering:
        Index depth_tI = GetDepthFirstSpecified(agI,tI,node);
        Index depth_node = node->GetDepth(); //this node's depth
#if DEBUG_VALID_ACTIONS            
        std::cout << "\tagent "<<agI<<"'s type ( tI="<<tI
                  <<" ) is first specified at depth_tI "<< depth_tI << std::endl;
        std::cout << "\tthis node's depth_node is " << depth_node << std::endl;
#endif
        if( depth_tI <= depth_node )
            //when depth_tI == depth_node, then *this* node specifies the 
            //action for tI. This means that the valid joint actions that 
            //can be assigned to children nodes of this node, are 
            //constrained!
            valid_action_set.at(agI) = node->GetSpecifiedAction(agI, depth_tI);
        else
        {
            ;
            //we do nothing because
            //  valid_action_set[agI] = {1,...,GetNrActions(agI) }
            //is encoded by valid_action_set[agI] = UNSPECIFIED_ACTION
            //(which is set already)
        }
#endif
#if DEBUG_VALID_ACTIONS            
        std::cout <<"\tvalid action for agI "<<agI<<" is " << 
            valid_action_set.at(agI) << std::endl;
#endif
    }
    std::vector<Index> curr_JA(_m_nrAgents);
    GenerateJointActions(valid_action_set,curr_JA, valid_JAs, 0);
#if DEBUG_VALID_ACTIONS            
    std::cout <<"Generated the following valid_JAs:"<<SoftPrintVector(valid_JAs)<<endl;
#endif
    //return(valid_JAs);
}